

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar __thiscall
Eigen::
DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<float,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>const,1,-1,true>const,1,-1,false>const,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const,-1,1,false>const>const>>
::redux<Eigen::internal::scalar_sum_op<float,float>>
          (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<float,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>>const,1,_1,true>const,1,_1,false>const,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const,_1,1,false>const>const>>
           *this,scalar_sum_op<float,_float> *func)

{
  bool bVar1;
  variable_if_dynamic<long,__1> func_00;
  Index IVar2;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>
  *pCVar3;
  Scalar SVar4;
  undefined1 local_50 [8];
  ThisEvaluator thisEval;
  scalar_sum_op<float,_float> *func_local;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>_>
  *this_local;
  
  thisEval.
  super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>_>
  .
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
  .m_d.rhsImpl.
  super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>
  .
  super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
  .m_argImpl.
  super_evaluator<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>
  .
  super_block_evaluator<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  .m_outerStride.m_value = (long)func;
  IVar2 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_true>,_1,_-1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_-1,_1,_false>_>_>_>
          ::rows((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>_>
                  *)this);
  bVar1 = false;
  if (0 < IVar2) {
    IVar2 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_true>,_1,_-1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_-1,_1,_false>_>_>_>
            ::cols((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>_>
                    *)this);
    bVar1 = false;
    if (0 < IVar2) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Redux.h"
                  ,0x19b,
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Block<const Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, -1, 1, -1, -1>, 0, Eigen::OuterStride<>>, 1, -1, true>, 1>, const Eigen::Transpose<const Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, 1>>, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Block<const Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, -1, 1, -1, -1>, 0, Eigen::OuterStride<>>, 1, -1, true>, 1>, const Eigen::Transpose<const Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, 1>>, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
                 );
  }
  pCVar3 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_true>,_1,_-1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_-1,_1,_false>_>_>_>
           ::derived((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>_>
                      *)this);
  internal::
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_true>,_1,_-1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_-1,_1,_false>_>_>_>
  ::redux_evaluator((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>_>
                     *)local_50,pCVar3);
  func_00 = thisEval.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
            .m_d.rhsImpl.
            super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>
            .
            super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
            .m_argImpl.
            super_evaluator<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>
            .
            super_block_evaluator<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
            .
            super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
            .m_outerStride;
  pCVar3 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_true>,_1,_-1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_-1,_1,_false>_>_>_>
           ::derived((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>_>
                      *)this);
  SVar4 = internal::
          redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<float,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>const,1,-1,true>const,1,-1,false>const,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const,-1,1,false>const>const>>,3,0>
          ::
          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<float,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>>const,1,_1,true>const,1,_1,false>const,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const,_1,1,false>const>const>>
                    ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>_>
                      *)local_50,(scalar_sum_op<float,_float> *)func_00.m_value,pCVar3);
  internal::
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_true>,_1,_-1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_-1,_1,_false>_>_>_>
  ::~redux_evaluator((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>_>
                      *)local_50);
  return SVar4;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}